

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O1

void __thiscall
spvtools::opt::analysis::DecorationManager::AnalyzeDecorations(DecorationManager *this)

{
  Module *pMVar1;
  Instruction *inst_00;
  Instruction *inst;
  
  pMVar1 = this->module_;
  if (pMVar1 != (Module *)0x0) {
    for (inst_00 = (pMVar1->annotations_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                   super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
        inst_00 != &(pMVar1->annotations_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
        ; inst_00 = (inst_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
      AddDecoration(this,inst_00);
    }
  }
  return;
}

Assistant:

void DecorationManager::AnalyzeDecorations() {
  if (!module_) return;

  // For each group and instruction, collect all their decoration instructions.
  for (Instruction& inst : module_->annotations()) {
    AddDecoration(&inst);
  }
}